

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManSortNums(int *pArray,int nVars)

{
  int iVar1;
  int local_20;
  int tmp;
  int best_i;
  int j;
  int i;
  int nVars_local;
  int *pArray_local;
  
  for (best_i = 0; best_i < nVars + -1; best_i = best_i + 1) {
    local_20 = best_i;
    tmp = best_i;
    while (tmp = tmp + 1, tmp < nVars) {
      if (pArray[local_20] < pArray[tmp]) {
        local_20 = tmp;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[local_20];
    pArray[local_20] = iVar1;
  }
  return;
}

Assistant:

void Aig_RManSortNums( int * pArray, int nVars )
{
    int i, j, best_i, tmp;
    for ( i = 0; i < nVars-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nVars; j++ )
            if ( pArray[j] > pArray[best_i] )
                best_i = j;
        tmp = pArray[i]; pArray[i] = pArray[best_i]; pArray[best_i] = tmp;
    }
}